

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

Object * __thiscall
Lodtalk::Behavior::basicNativeNew(Behavior *this,VMContext *context,size_t indexableSize)

{
  SmallIntegerValue SVar1;
  size_t fixedSlotCount_00;
  ObjectHeader *pOVar2;
  uint classIndex;
  SmallIntegerValue fixedSlotCount;
  ObjectFormat theFormat;
  size_t indexableSize_local;
  VMContext *context_local;
  Behavior *this_local;
  
  SVar1 = Oop::decodeSmallInteger(&this->format);
  fixedSlotCount_00 = Oop::decodeSmallInteger(&this->fixedVariableCount);
  pOVar2 = VMContext::newObject
                     (context,fixedSlotCount_00,indexableSize,(ObjectFormat)SVar1,
                      (uint)((ulong)(this->super_Object).super_ProtoObject.object_header_ >> 10) &
                      0x3fffff,-1);
  return (Object *)pOVar2;
}

Assistant:

Object *Behavior::basicNativeNew(VMContext *context, size_t indexableSize)
{
	auto theFormat = (ObjectFormat)format.decodeSmallInteger();
	auto fixedSlotCount = fixedVariableCount.decodeSmallInteger();
	auto classIndex = object_header_.identityHash;
	return reinterpret_cast<Object*> (context->newObject(fixedSlotCount, indexableSize, theFormat, classIndex));
}